

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,char *macroName,SourceLineInfo *lineInfo,char *capturedExpression,
          Flags resultDisposition,char *secondArg)

{
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,macroName,&local_33);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,capturedExpression,&local_32);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,secondArg,&local_31);
  capturedExpressionWithSecondArgument(&local_98,&local_78,&local_58);
  AssertionInfo::AssertionInfo
            (&this->m_assertionInfo,&local_b8,lineInfo,&local_98,resultDisposition);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (this->m_data).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_data).reconstructedExpression.field_2;
  (this->m_data).reconstructedExpression._M_string_length = 0;
  (this->m_data).reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_data).message._M_dataplus._M_p = (pointer)&(this->m_data).message.field_2;
  (this->m_data).message._M_string_length = 0;
  (this->m_data).message.field_2._M_local_buf[0] = '\0';
  (this->m_data).resultType = Unknown;
  (this->m_exprComponents).testFalse = false;
  (this->m_exprComponents).lhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).lhs.field_2;
  (this->m_exprComponents).lhs._M_string_length = 0;
  (this->m_exprComponents).lhs.field_2._M_local_buf[0] = '\0';
  (this->m_exprComponents).rhs._M_dataplus._M_p = (pointer)&(this->m_exprComponents).rhs.field_2;
  (this->m_exprComponents).rhs._M_string_length = 0;
  (this->m_exprComponents).rhs.field_2._M_local_buf[0] = '\0';
  (this->m_exprComponents).op._M_dataplus._M_p = (pointer)&(this->m_exprComponents).op.field_2;
  (this->m_exprComponents).op._M_string_length = 0;
  (this->m_exprComponents).op.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  this->m_shouldDebugBreak = false;
  this->m_shouldThrow = false;
  return;
}

Assistant:

ResultBuilder::ResultBuilder(   char const* macroName,
                                    SourceLineInfo const& lineInfo,
                                    char const* capturedExpression,
                                    ResultDisposition::Flags resultDisposition,
                                    char const* secondArg )
    :   m_assertionInfo( macroName, lineInfo, capturedExpressionWithSecondArgument( capturedExpression, secondArg ), resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}